

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jccolor.c
# Opt level: O3

void null_convert(j_decompress_ptr cinfo,JSAMPIMAGE input_buf,JDIMENSION input_row,
                 JSAMPARRAY output_buf,int num_rows)

{
  int iVar1;
  JSAMPROW pJVar2;
  JSAMPROW pJVar3;
  JSAMPROW pJVar4;
  bool bVar5;
  ulong uVar6;
  JSAMPROW pJVar7;
  long lVar8;
  long lVar9;
  JSAMPROW pJVar10;
  ulong uVar11;
  
  iVar1 = cinfo->num_components;
  lVar8 = (long)iVar1;
  uVar6 = (ulong)cinfo->output_width;
  if (lVar8 == 3) {
    if (0 < num_rows) {
      do {
        if (uVar6 != 0) {
          pJVar2 = (*input_buf)[input_row];
          pJVar7 = input_buf[1][input_row];
          pJVar3 = input_buf[2][input_row];
          pJVar10 = *output_buf;
          uVar11 = 0;
          do {
            *pJVar10 = pJVar2[uVar11];
            pJVar10[1] = pJVar7[uVar11];
            pJVar10[2] = pJVar3[uVar11];
            pJVar10 = pJVar10 + 3;
            uVar11 = uVar11 + 1;
          } while (uVar6 != uVar11);
        }
        input_row = input_row + 1;
        output_buf = output_buf + 1;
        bVar5 = 1 < num_rows;
        num_rows = num_rows + -1;
      } while (bVar5);
    }
  }
  else if (iVar1 == 4) {
    if (0 < num_rows) {
      do {
        if (uVar6 != 0) {
          pJVar2 = (*input_buf)[input_row];
          pJVar7 = input_buf[1][input_row];
          pJVar3 = input_buf[2][input_row];
          pJVar10 = input_buf[3][input_row];
          pJVar4 = *output_buf;
          uVar11 = 0;
          do {
            pJVar4[uVar11 * 4] = pJVar2[uVar11];
            pJVar4[uVar11 * 4 + 1] = pJVar7[uVar11];
            pJVar4[uVar11 * 4 + 2] = pJVar3[uVar11];
            pJVar4[uVar11 * 4 + 3] = pJVar10[uVar11];
            uVar11 = uVar11 + 1;
          } while (uVar6 != uVar11);
        }
        input_row = input_row + 1;
        output_buf = output_buf + 1;
        bVar5 = 1 < num_rows;
        num_rows = num_rows + -1;
      } while (bVar5);
    }
  }
  else if (0 < num_rows) {
    do {
      if (0 < iVar1) {
        lVar9 = 0;
        do {
          if (uVar6 != 0) {
            pJVar2 = input_buf[lVar9][input_row];
            pJVar7 = *output_buf + lVar9;
            uVar11 = 0;
            do {
              *pJVar7 = pJVar2[uVar11];
              uVar11 = uVar11 + 1;
              pJVar7 = pJVar7 + lVar8;
            } while (uVar6 != uVar11);
          }
          lVar9 = lVar9 + 1;
        } while (lVar9 != lVar8);
      }
      output_buf = output_buf + 1;
      input_row = input_row + 1;
      bVar5 = 1 < num_rows;
      num_rows = num_rows + -1;
    } while (bVar5);
  }
  return;
}

Assistant:

METHODDEF(void)
null_convert(j_compress_ptr cinfo, JSAMPARRAY input_buf, JSAMPIMAGE output_buf,
             JDIMENSION output_row, int num_rows)
{
  register JSAMPROW inptr;
  register JSAMPROW outptr, outptr0, outptr1, outptr2, outptr3;
  register JDIMENSION col;
  register int ci;
  int nc = cinfo->num_components;
  JDIMENSION num_cols = cinfo->image_width;

  if (nc == 3) {
    while (--num_rows >= 0) {
      inptr = *input_buf++;
      outptr0 = output_buf[0][output_row];
      outptr1 = output_buf[1][output_row];
      outptr2 = output_buf[2][output_row];
      output_row++;
      for (col = 0; col < num_cols; col++) {
        outptr0[col] = *inptr++;
        outptr1[col] = *inptr++;
        outptr2[col] = *inptr++;
      }
    }
  } else if (nc == 4) {
    while (--num_rows >= 0) {
      inptr = *input_buf++;
      outptr0 = output_buf[0][output_row];
      outptr1 = output_buf[1][output_row];
      outptr2 = output_buf[2][output_row];
      outptr3 = output_buf[3][output_row];
      output_row++;
      for (col = 0; col < num_cols; col++) {
        outptr0[col] = *inptr++;
        outptr1[col] = *inptr++;
        outptr2[col] = *inptr++;
        outptr3[col] = *inptr++;
      }
    }
  } else {
    while (--num_rows >= 0) {
      /* It seems fastest to make a separate pass for each component. */
      for (ci = 0; ci < nc; ci++) {
        inptr = *input_buf;
        outptr = output_buf[ci][output_row];
        for (col = 0; col < num_cols; col++) {
          outptr[col] = inptr[ci];
          inptr += nc;
        }
      }
      input_buf++;
      output_row++;
    }
  }
}